

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack6_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar4 = *in;
  auVar5 = vpbroadcastd_avx512vl();
  uVar1 = *(ulong *)(in + 1);
  uVar6 = (uint)uVar1;
  auVar7._4_4_ = uVar6;
  auVar7._0_4_ = uVar6;
  auVar7._8_4_ = uVar6;
  auVar7._12_4_ = uVar6;
  auVar7 = vpinsrd_avx(auVar7,uVar4,0);
  auVar2 = vpsrlvd_avx2(auVar5,_DAT_001a5e00);
  auVar5 = vpinsrd_avx(auVar5,uVar4 >> 6,1);
  auVar5 = vpunpcklqdq_avx(auVar5,auVar2);
  auVar8._8_4_ = 0x3f;
  auVar8._0_8_ = 0x3f0000003f;
  auVar8._12_4_ = 0x3f;
  auVar5 = vpand_avx(auVar5,auVar8);
  *(undefined1 (*) [16])out = auVar5;
  out[4] = uVar4 >> 0x18 & 0x3f;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar2 = vpshufd_avx(auVar5,0x54);
  auVar5 = vpshufd_avx(auVar7,0x54);
  auVar3 = vpsrlvd_avx2(auVar5,_DAT_001a5e10);
  auVar5 = vpinsrd_avx(auVar8,uVar6 * 4 & 0x3c,0);
  auVar7 = vpor_avx(auVar3,auVar5);
  auVar5 = vpand_avx(auVar3,auVar8);
  auVar5 = vpblendd_avx2(auVar5,auVar7,1);
  *(undefined1 (*) [16])(out + 5) = auVar5;
  out[9] = uVar6 >> 0x16 & 0x3f;
  auVar2 = vpsrlvd_avx2(auVar2,_DAT_001a5e60);
  uVar4 = (uint)(uVar1 >> 0x20);
  auVar5 = vpinsrd_avx(auVar8,(uVar4 & 3) << 4,0);
  auVar7 = vpor_avx(auVar2,auVar5);
  auVar5 = vpand_avx(auVar2,auVar8);
  auVar5 = vpblendd_avx2(auVar5,auVar7,1);
  *(undefined1 (*) [16])(out + 10) = auVar5;
  out[0xe] = uVar4 >> 0x14 & 0x3f;
  out[0xf] = uVar4 >> 0x1a;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack6_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;

  return in;
}